

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwrite.c
# Opt level: O0

size_t fwrite(void *__ptr,size_t __size,size_t __n,FILE *__s)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  size_t bufidx;
  size_t size_i;
  size_t nmemb_i;
  unsigned_long offset;
  _PDCLIB_file_t *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  nmemb_i = 0;
  mtx_lock((mtx_t *)&__s->_IO_save_base);
  iVar3 = _PDCLIB_prepwrite((_PDCLIB_file_t *)__s);
  if (iVar3 == -1) {
    mtx_unlock((mtx_t *)&__s->_IO_save_base);
    ptr_local = (void *)0x0;
  }
  else {
    for (size_i = 0; size_i < __n; size_i = size_i + 1) {
      for (bufidx = 0; bufidx < __size; bufidx = bufidx + 1) {
        cVar1 = *(char *)((long)__ptr + size_i * __size + bufidx);
        pcVar2 = __s->_IO_read_base;
        __s->_IO_read_base = pcVar2 + 1;
        __s->_IO_read_ptr[(long)pcVar2] = cVar1;
        if (cVar1 == '\n') {
          nmemb_i = (size_t)__s->_IO_read_base;
        }
        if (__s->_IO_read_base == __s->_IO_read_end) {
          iVar3 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__s);
          if (iVar3 == -1) {
            mtx_unlock((mtx_t *)&__s->_IO_save_base);
            return size_i;
          }
          nmemb_i = 0;
        }
      }
    }
    uVar4 = *(uint *)((long)&__s->_IO_buf_end + 4) & 6;
    if (uVar4 == 2) {
      if (nmemb_i != 0) {
        pcVar2 = __s->_IO_read_base;
        __s->_IO_read_base = (char *)nmemb_i;
        iVar3 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__s);
        if (iVar3 == -1) {
          __s->_IO_read_base = pcVar2;
          mtx_unlock((mtx_t *)&__s->_IO_save_base);
          return size_i - 1;
        }
        __s->_IO_read_base = pcVar2 + -nmemb_i;
        memmove(__s->_IO_read_ptr,__s->_IO_read_ptr + nmemb_i,(size_t)__s->_IO_read_base);
      }
    }
    else if ((uVar4 == 4) && (iVar3 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__s), iVar3 == -1)) {
      mtx_unlock((mtx_t *)&__s->_IO_save_base);
      return size_i - 1;
    }
    mtx_unlock((mtx_t *)&__s->_IO_save_base);
    ptr_local = (void *)size_i;
  }
  return (size_t)ptr_local;
}

Assistant:

size_t fwrite( const void * _PDCLIB_restrict ptr, size_t size, size_t nmemb, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    _PDCLIB_size_t offset = 0;
    /* TODO: lineend */
    /* int lineend = 0; */
    size_t nmemb_i;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepwrite( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return 0;
    }

    for ( nmemb_i = 0; nmemb_i < nmemb; ++nmemb_i )
    {
        size_t size_i;

        for ( size_i = 0; size_i < size; ++size_i )
        {
            if ( ( stream->buffer[ stream->bufidx++ ] = ( ( char * )ptr )[ nmemb_i * size + size_i ] ) == '\n' )
            {
                /* Remember last newline, in case we have to do a partial line-buffered flush */
                offset = stream->bufidx;
                /* lineend = true; */
            }

            if ( stream->bufidx == stream->bufsize )
            {
                if ( _PDCLIB_flushbuffer( stream ) == EOF )
                {
                    /* Returning number of objects completely buffered */
                    _PDCLIB_UNLOCK( stream->mtx );
                    return nmemb_i;
                }

                offset = 0;
                /* lineend = false; */
            }
        }
    }

    /* Fully-buffered streams are OK. Non-buffered streams must be flushed,
       line-buffered streams only if there's a newline in the buffer.
    */
    switch ( stream->status & ( _IONBF | _IOLBF ) )
    {
        case _IONBF:
            if ( _PDCLIB_flushbuffer( stream ) == EOF )
            {
                /* We are in a pinch here. We have an error, which requires a
                   return value < nmemb. On the other hand, all objects have
                   been written to buffer, which means all the caller had to
                   do was removing the error cause, and re-flush the stream...
                   Catch 22. We'll return a value one short, to indicate the
                   error, and can't really do anything about the inconsistency.
                */
                _PDCLIB_UNLOCK( stream->mtx );
                return nmemb_i - 1;
            }

            break;

        case _IOLBF:
            if ( offset > 0 )
            {
                size_t bufidx = stream->bufidx;
                stream->bufidx = offset;

                if ( _PDCLIB_flushbuffer( stream ) == EOF )
                {
                    /* See comment above. */
                    stream->bufidx = bufidx;
                    _PDCLIB_UNLOCK( stream->mtx );
                    return nmemb_i - 1;
                }

                stream->bufidx = bufidx - offset;
                memmove( stream->buffer, stream->buffer + offset, stream->bufidx );
            }
    }

    _PDCLIB_UNLOCK( stream->mtx );
    return nmemb_i;
}